

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O0

void test_bool_storage(void)

{
  bool bVar1;
  reference_type rVar2;
  value_type local_d;
  compact_optional<ak_toolbox::compact_optional_ns::evp_bool,_ak_toolbox::compact_optional_ns::default_tag>
  local_c;
  value_type local_b;
  compact_optional<ak_toolbox::compact_optional_ns::evp_bool,_ak_toolbox::compact_optional_ns::default_tag>
  local_a;
  compact_optional<ak_toolbox::compact_optional_ns::evp_bool,_ak_toolbox::compact_optional_ns::default_tag>
  local_9 [5];
  opt_bool obF;
  opt_bool obT;
  opt_bool ob_;
  
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_bool,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(local_9);
  local_b = true;
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_bool,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&local_a,&local_b);
  local_d = false;
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_bool,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&local_c,&local_d);
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_bool>::has_value
                    (&local_9[0].
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_bool>);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!ob_.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x6a,"void test_bool_storage()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_bool>::has_value
                    (&local_a.super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_bool>
                    );
  if (!bVar1) {
    __assert_fail("obT.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x6c,"void test_bool_storage()");
  }
  rVar2 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_bool>::value
                    (&local_a.super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_bool>
                    );
  if (!rVar2) {
    __assert_fail("obT.value() == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x6d,"void test_bool_storage()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_bool>::has_value
                    (&local_c.super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_bool>
                    );
  if (!bVar1) {
    __assert_fail("obF.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x6f,"void test_bool_storage()");
  }
  rVar2 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_bool>::value
                    (&local_c.super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_bool>
                    );
  if (!rVar2) {
    return;
  }
  __assert_fail("obF.value() == false",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                ,0x70,"void test_bool_storage()");
}

Assistant:

void test_bool_storage()
{
  typedef compact_optional<evp_bool> opt_bool;
  static_assert (sizeof(opt_bool) == 1, "size waste");
  
  opt_bool ob_, obT(true), obF(false);
  assert (!ob_.has_value());
  
  assert (obT.has_value());
  assert (obT.value() == true);
  
  assert (obF.has_value());
  assert (obF.value() == false);
}